

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

void __thiscall
re2::Prog::MarkDominator
          (Prog *this,int root,SparseArray<int> *rootmap,SparseArray<int> *predmap,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *predvec,SparseSet *reachable,vector<int,_std::allocator<int>_> *stk)

{
  int i;
  Inst *pIVar1;
  pointer pvVar2;
  int *piVar3;
  bool bVar4;
  int *piVar5;
  int *piVar6;
  iterator iVar7;
  uint i_00;
  uint local_54;
  int local_50;
  anon_union_4_5_a3ff96c3_for_Inst_2 local_4c;
  SparseArray<int> *local_48;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_40;
  Prog *local_38;
  uint32_t uVar8;
  
  reachable->size_ = 0;
  piVar6 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar7._M_current =
       (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar7._M_current != piVar6) {
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar6;
    iVar7._M_current = piVar6;
  }
  local_54 = root;
  local_48 = predmap;
  local_40 = predvec;
  local_38 = this;
  if (iVar7._M_current ==
      (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)stk,iVar7,(int *)&local_54);
    piVar6 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar5 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
  }
  else {
    *iVar7._M_current = root;
    piVar5 = iVar7._M_current + 1;
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar5;
  }
  if (piVar6 != piVar5) {
    do {
      i_00 = piVar5[-1];
      (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
           = piVar5 + -1;
      while ((bVar4 = SparseSetT<void>::contains(reachable,i_00), !bVar4 &&
             ((SparseSetT<void>::InsertInternal(reachable,false,i_00), i_00 == local_54 ||
              (bVar4 = SparseArray<int>::has_index(rootmap,i_00), !bVar4))))) {
        pIVar1 = (local_38->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
        uVar8 = pIVar1[(int)i_00].out_opcode_;
        if ((3U >> (uVar8 & 7) & 1) == 0) {
          if ((uVar8 & 7) != 6) break;
        }
        else {
          if ((uVar8 & 6) != 0) {
            __assert_fail("opcode() == kInstAlt || opcode() == kInstAltMatch",
                          "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/prog.h"
                          ,0x55,"int re2::Prog::Inst::out1()");
          }
          local_4c = pIVar1[(int)i_00].field_1;
          iVar7._M_current =
               (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
          if (iVar7._M_current ==
              (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(stk,iVar7,&local_4c.cap_)
            ;
          }
          else {
            *iVar7._M_current = (int)local_4c;
            (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar7._M_current + 1;
          }
          uVar8 = pIVar1[(int)i_00].out_opcode_;
        }
        i_00 = uVar8 >> 4;
      }
      piVar5 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
    } while ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start != piVar5);
  }
  if (reachable->size_ != 0) {
    piVar6 = (reachable->dense_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
             _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    do {
      i = *piVar6;
      bVar4 = SparseArray<int>::has_index(local_48,i);
      if (bVar4) {
        piVar5 = SparseArray<int>::get_existing(local_48,i);
        pvVar2 = (local_40->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        piVar3 = *(pointer *)
                  ((long)&pvVar2[*piVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        for (piVar5 = pvVar2[*piVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start; piVar5 != piVar3; piVar5 = piVar5 + 1) {
          bVar4 = SparseSetT<void>::contains(reachable,*piVar5);
          if ((!bVar4) && (bVar4 = SparseArray<int>::has_index(rootmap,i), !bVar4)) {
            local_50 = rootmap->size_;
            SparseArray<int>::SetInternal(rootmap,false,i,&local_50);
          }
        }
      }
      piVar6 = piVar6 + 1;
    } while (piVar6 != (reachable->dense_).ptr_._M_t.
                       super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                       super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl + reachable->size_);
  }
  return;
}

Assistant:

void Prog::MarkDominator(int root, SparseArray<int>* rootmap,
                         SparseArray<int>* predmap,
                         std::vector<std::vector<int>>* predvec,
                         SparseSet* reachable, std::vector<int>* stk) {
  reachable->clear();
  stk->clear();
  stk->push_back(root);
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (reachable->contains(id))
      continue;
    reachable->insert_new(id);

    if (id != root && rootmap->has_index(id)) {
      // We reached another "tree" via epsilon transition.
      continue;
    }

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        break;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        break;
    }
  }

  for (SparseSet::const_iterator i = reachable->begin();
       i != reachable->end();
       ++i) {
    int id = *i;
    if (predmap->has_index(id)) {
      for (int pred : (*predvec)[predmap->get_existing(id)]) {
        if (!reachable->contains(pred)) {
          // id has a predecessor that cannot be reached from root!
          // Therefore, id must be a "root" too - mark it as such.
          if (!rootmap->has_index(id))
            rootmap->set_new(id, rootmap->size());
        }
      }
    }
  }
}